

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

void __thiscall Js::JavascriptArray::SetLength(JavascriptArray *this,uint32 newLength)

{
  DynamicObjectFlags DVar1;
  SparseArraySegmentBase *pSVar2;
  SparseArraySegmentBase *this_00;
  uint uVar3;
  Type *pTVar4;
  
  uVar3 = (this->super_ArrayObject).length;
  if (uVar3 == newLength) {
    return;
  }
  pSVar2 = (this->head).ptr;
  if (pSVar2 != EmptySegment) {
    if (newLength == 0) {
      (*(this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject
        .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x73])(this,pSVar2,0);
      pSVar2 = (this->head).ptr;
      pSVar2->length = 0;
      (pSVar2->next).ptr = (SparseArraySegmentBase *)0x0;
      DVar1 = DynamicObject::GetArrayFlags((DynamicObject *)this);
      DynamicObject::SetArrayFlags((DynamicObject *)this,DVar1 | HasNoMissingValues);
      ClearSegmentMap(this);
    }
    else {
      if (uVar3 <= newLength) goto LAB_00b7c790;
      pSVar2 = GetBeginLookupSegment(this,newLength - 1,true);
      if (pSVar2 != (SparseArraySegmentBase *)0x0) {
        uVar3 = pSVar2->left;
        if (uVar3 < newLength) {
          do {
            this_00 = pSVar2;
            if (newLength <= uVar3 + this_00->length) {
              if ((this_00->next).ptr != (SparseArraySegmentBase *)0x0) {
                ClearSegmentMap(this);
              }
              uVar3 = newLength - this_00->left;
              (*(this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x73])(this,this_00,(ulong)uVar3);
              (this_00->next).ptr = (SparseArraySegmentBase *)0x0;
              this_00->length = uVar3;
              SparseArraySegmentBase::CheckLengthvsSize(this_00);
              goto LAB_00b7c784;
            }
            pSVar2 = (this_00->next).ptr;
            if (pSVar2 == (SparseArraySegmentBase *)0x0) goto LAB_00b7c784;
            uVar3 = pSVar2->left;
          } while (uVar3 < newLength);
          pTVar4 = &this_00->next;
        }
        else {
          pTVar4 = &this->head;
        }
        ClearSegmentMap(this);
        pTVar4->ptr = (SparseArraySegmentBase *)0x0;
      }
    }
LAB_00b7c784:
    SetLastUsedSegment(this,(this->head).ptr);
  }
LAB_00b7c790:
  (this->super_ArrayObject).length = newLength;
  (*(this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])(this);
  return;
}

Assistant:

void JavascriptArray::SetLength(uint32 newLength)
    {
        if (newLength == length)
            return;

        if (head == EmptySegment)
        {
            // Do nothing to the segment.
        }
        else if (newLength == 0)
        {
            this->ClearElements(head, 0);
            head->length = 0;
            head->next = nullptr;
            SetHasNoMissingValues();

            ClearSegmentMap();
            this->InvalidateLastUsedSegment();
        }
        else if (newLength < length)
        {
            // _ _ 2 3 _ _ 6 7 _ _

            // SetLength(0)
            // 0 <= left -> set *prev = null
            // SetLength(2)
            // 2 <= left -> set *prev = null
            // SetLength(3)
            // 3 !<= left; 3 <= right -> truncate to length - 1
            // SetLength(5)
            // 5 <=

            SparseArraySegmentBase* next = GetBeginLookupSegment(newLength - 1); // head, or next.left < newLength
            Field(SparseArraySegmentBase*)* prev = &head;

            while(next != nullptr)
            {
                if (newLength <= next->left)
                {
                    ClearSegmentMap(); // truncate segments, null out segmentMap
                    *prev = nullptr;
                    break;
                }
                else if (newLength <= (next->left + next->length))
                {
                    if (next->next)
                    {
                        ClearSegmentMap(); // Will truncate segments, null out segmentMap
                    }

                    uint32 newSegmentLength = newLength - next->left;
                    this->ClearElements(next, newSegmentLength);
                    next->next = nullptr;
                    next->length = newSegmentLength;
                    next->CheckLengthvsSize();
                    break;
                }
                else
                {
                    prev = &next->next;
                    next = next->next;
                }
            }
            this->InvalidateLastUsedSegment();
        }
        this->length = newLength;

#ifdef VALIDATE_ARRAY
        ValidateArray();
#endif
    }